

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O3

void png_read_filter_row_up(png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = row_info->rowbytes;
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      row[sVar2] = row[sVar2] + prev_row[sVar2];
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  return;
}

Assistant:

static void
png_read_filter_row_up(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   size_t i;
   size_t istop = row_info->rowbytes;
   png_bytep rp = row;
   png_const_bytep pp = prev_row;

   for (i = 0; i < istop; i++)
   {
      *rp = (png_byte)(((int)(*rp) + (int)(*pp++)) & 0xff);
      rp++;
   }
}